

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall
front::symbol::IntSymbol::IntSymbol
          (IntSymbol *this,string *name,int layer_num,bool is_const,int value)

{
  int iVar1;
  byte in_CL;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  string *name_00;
  Symbol *in_stack_ffffffffffffffb0;
  string local_40;
  undefined4 local_1c;
  byte local_15;
  
  local_15 = in_CL & 1;
  name_00 = &local_40;
  local_1c = in_R8D;
  std::__cxx11::string::string((string *)name_00,in_RSI);
  Symbol::Symbol(in_stack_ffffffffffffffb0,name_00,(int)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)&local_40);
  *in_RDI = &PTR_kind_0036fb20;
  *(byte *)(in_RDI + 6) = local_15 & 1;
  *(undefined4 *)((long)in_RDI + 0x34) = local_1c;
  *(undefined4 *)(in_RDI + 7) = 4;
  iVar1 = Symbol::symbolId + 1;
  *(int *)((long)in_RDI + 0x2c) = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

IntSymbol(string name, int layer_num, bool is_const, int value = 0)
      : _is_const(is_const), _value(value), Symbol(name, layer_num) {
    id = Symbol::symbolId++;
  }